

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

iterator __thiscall
fmt::v6::internal::
arg_formatter_base<fmt::v6::buffer_range<wchar_t>,_fmt::v6::internal::error_handler>::operator()
          (arg_formatter_base<fmt::v6::buffer_range<wchar_t>,_fmt::v6::internal::error_handler>
           *this,void *value)

{
  error_handler local_11;
  
  if (this->specs_ != (format_specs *)0x0) {
    check_pointer_type_spec<char,fmt::v6::internal::error_handler>(this->specs_->type,&local_11);
  }
  write_pointer(this,value);
  return (iterator)(this->writer_).out_.container;
}

Assistant:

iterator operator()(const void* value) {
    if (specs_)
      check_pointer_type_spec(specs_->type, internal::error_handler());
    write_pointer(value);
    return out();
  }